

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string the_locale;
  undefined1 local_98 [8];
  string req_locale;
  undefined1 local_70 [8];
  string arg;
  int argi;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string tests_data_path;
  char **argv_local;
  int argc_local;
  
  tests_data_path.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"tests/",&local_39);
  std::allocator<char>::~allocator(&local_39);
  arg.field_2._8_4_ = 1;
  while( true ) {
    if (argc <= (int)arg.field_2._8_4_) {
      InitTestEngine((TestFailEventListener)0x0);
      std::__cxx11::string::string((string *)local_98);
      bVar1 = flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",(string *)local_98);
      if (bVar1) {
        do {
          uVar3 = std::__cxx11::string::c_str();
          printf("The environment variable FLATBUFFERS_TEST_LOCALE=%s",uVar3);
          printf("\n");
          bVar1 = flatbuffers::IsConstTrue<bool>(true);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        flatbuffers::RemoveStringQuotes
                  ((string *)((long)&the_locale.field_2 + 8),(string *)local_98);
        std::__cxx11::string::operator=
                  ((string *)local_98,(string *)(the_locale.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(the_locale.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_d8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = flatbuffers::SetGlobalTestLocale(pcVar4,(string *)local_d8);
        TestEq<bool,bool>(true,bVar1,
                          "\'true\' != \'flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale)\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test.cpp"
                          ,0x6d5,"int main(int, const char **)");
        do {
          uVar3 = std::__cxx11::string::c_str();
          printf("The global C-locale changed: %s",uVar3);
          printf("\n");
          bVar1 = flatbuffers::IsConstTrue<bool>(true);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
        std::__cxx11::string::~string((string *)local_d8);
      }
      std::operator+(&local_f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      flatbuffers::tests::anon_unknown_0::FlatBufferTests((string *)local_38);
      FlatBufferBuilderTest();
      if (testing_fails == 0) {
        do {
          printf("ALL TESTS PASSED");
          printf("\n");
          bVar1 = flatbuffers::IsConstTrue<bool>(true);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
      }
      else {
        do {
          printf("%d FAILED TESTS",(ulong)(uint)testing_fails);
          printf("\n");
          bVar1 = flatbuffers::IsConstTrue<bool>(true);
        } while (((bVar1 ^ 0xffU) & 1) != 0);
      }
      iVar2 = CloseTestEngine(false);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_38);
      return iVar2;
    }
    pcVar4 = *(char **)(tests_data_path.field_2._8_8_ + (long)(int)arg.field_2._8_4_ * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,pcVar4,(allocator<char> *)(req_locale.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::~allocator((allocator<char> *)(req_locale.field_2._M_local_buf + 0xf));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"--test_path");
    __stream = _stderr;
    if (!bVar1) break;
    arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
    if (argc <= (int)arg.field_2._8_4_) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"error: missing path following: %s\n",uVar3);
      exit(1);
    }
    std::__cxx11::string::operator=
              ((string *)local_38,
               *(char **)(tests_data_path.field_2._8_8_ + (long)(int)arg.field_2._8_4_ * 8));
    std::__cxx11::string::~string((string *)local_70);
    arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
  }
  uVar3 = std::__cxx11::string::c_str();
  fprintf(__stream,"error: Unknown argument: %s\n",uVar3);
  exit(1);
}

Assistant:

int main(int argc, const char *argv[]) {
  std::string tests_data_path = "tests/";

  for (int argi = 1; argi < argc; argi++) {
    std::string arg = argv[argi];
    if (arg == "--test_path") {
      if (++argi >= argc) {
        fprintf(stderr, "error: missing path following: %s\n", arg.c_str());
        exit(1);
      }
      // Override default path if provided one.
      tests_data_path = argv[argi];

    } else {
      fprintf(stderr, "error: Unknown argument: %s\n", arg.c_str());
      exit(1);
    }
  }

  InitTestEngine();

  std::string req_locale;
  if (flatbuffers::ReadEnvironmentVariable("FLATBUFFERS_TEST_LOCALE",
                                           &req_locale)) {
    TEST_OUTPUT_LINE("The environment variable FLATBUFFERS_TEST_LOCALE=%s",
                     req_locale.c_str());
    req_locale = flatbuffers::RemoveStringQuotes(req_locale);
    std::string the_locale;
    TEST_ASSERT_FUNC(
        flatbuffers::SetGlobalTestLocale(req_locale.c_str(), &the_locale));
    TEST_OUTPUT_LINE("The global C-locale changed: %s", the_locale.c_str());
  }

#ifdef FLATBUFFERS_TEST_PATH_PREFIX
  tests_data_path =
      FLATBUFFERS_STRING(FLATBUFFERS_TEST_PATH_PREFIX) + tests_data_path;
#endif

  flatbuffers::tests::FlatBufferTests(tests_data_path);
  FlatBufferBuilderTest();

  if (!testing_fails) {
    TEST_OUTPUT_LINE("ALL TESTS PASSED");
  } else {
    TEST_OUTPUT_LINE("%d FAILED TESTS", testing_fails);
  }
  return CloseTestEngine();
}